

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRGraphicsWindowNode.cpp
# Opt level: O2

void __thiscall
MinVR::VRGraphicsWindowNode::VRGraphicsWindowNode
          (VRGraphicsWindowNode *this,string *name,VRGraphicsToolkit *gfxToolkit,
          VRWindowToolkit *winToolkit,VRWindowSettings *settings)

{
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  VRWindowToolkit *pVVar1;
  int iVar2;
  allocator<char> local_a9;
  value_type local_a8;
  undefined1 local_88 [104];
  
  VRDisplayNode::VRDisplayNode(&this->super_VRDisplayNode,name);
  (this->super_VRDisplayNode)._vptr_VRDisplayNode =
       (_func_int **)&PTR__VRGraphicsWindowNode_0015d638;
  this->_gfxToolkit = gfxToolkit;
  this->_winToolkit = winToolkit;
  VRWindowSettings::VRWindowSettings(&this->_settings,settings);
  pVVar1 = this->_winToolkit;
  VRWindowSettings::VRWindowSettings((VRWindowSettings *)local_88,&this->_settings);
  iVar2 = (**(code **)(*(long *)pVVar1 + 0x18))(pVVar1,local_88);
  this->_windowID = iVar2;
  std::__cxx11::string::~string((string *)(local_88 + 0x18));
  (**(code **)(*(long *)this->_winToolkit + 0x38))
            (this->_winToolkit,this->_windowID,&this->_framebufferWidth,&this->_framebufferHeight);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"WindowX",&local_a9);
  this_00 = &(this->super_VRDisplayNode)._valuesAdded;
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this_00,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"WindowY",&local_a9);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this_00,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"WindowWidth",&local_a9);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this_00,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"WindowHeight",&local_a9);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this_00,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"FramebufferWidth",&local_a9);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this_00,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"FramebufferHeight",&local_a9);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this_00,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"SharedContextId",&local_a9);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this_00,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"WindowID",&local_a9);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this_00,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  return;
}

Assistant:

VRGraphicsWindowNode::VRGraphicsWindowNode(const std::string &name, VRGraphicsToolkit *gfxToolkit, VRWindowToolkit *winToolkit, const VRWindowSettings &settings) : 
  VRDisplayNode(name), _gfxToolkit(gfxToolkit), _winToolkit(winToolkit), _settings(settings)
{
  _windowID = _winToolkit->createWindow(_settings);
  _winToolkit->getFramebufferSize(_windowID, _framebufferWidth, _framebufferHeight);
  _valuesAdded.push_back("WindowX");
  _valuesAdded.push_back("WindowY");
  _valuesAdded.push_back("WindowWidth");
  _valuesAdded.push_back("WindowHeight");
  _valuesAdded.push_back("FramebufferWidth");
  _valuesAdded.push_back("FramebufferHeight");
  _valuesAdded.push_back("SharedContextId");
  _valuesAdded.push_back("WindowID");

}